

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall QList<QDnsMailExchangeRecord>::data(QList<QDnsMailExchangeRecord> *this)

{
  QArrayDataPointer<QDnsMailExchangeRecord> *this_00;
  QDnsMailExchangeRecord *pQVar1;
  QArrayDataPointer<QDnsMailExchangeRecord> *in_RDI;
  
  detach((QList<QDnsMailExchangeRecord> *)0x3517ac);
  this_00 = (QArrayDataPointer<QDnsMailExchangeRecord> *)
            QArrayDataPointer<QDnsMailExchangeRecord>::operator->(in_RDI);
  pQVar1 = QArrayDataPointer<QDnsMailExchangeRecord>::data(this_00);
  return pQVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }